

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdUnopZero<unsigned_int,double>
          (Thread *this,UnopFunc<unsigned_int,_double> *f)

{
  uint uVar1;
  uint uVar2;
  Value VVar3;
  
  VVar3 = Pop(this);
  uVar1 = (*f)((double)VVar3.field_0.i64_);
  uVar2 = (*f)(VVar3.field_0._8_8_);
  VVar3.field_0.i64_._4_4_ = uVar2;
  VVar3.field_0.i32_ = uVar1;
  VVar3.field_0._8_8_ = 0;
  Push(this,VVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnopZero(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  for (u8 i = 0; i < ST::lanes; ++i) {
    result[i] = f(val[i]);
  }
  for (u8 i = ST::lanes; i < SR::lanes; ++i) {
    result[i] = 0;
  }
  Push(result);
  return RunResult::Ok;
}